

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O1

uint8_t * __thiscall
editions_unittest::TestDelimited::_InternalSerialize
          (TestDelimited *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  TestDelimited_LengthPrefixed *value;
  ulong uVar2;
  uint8_t *puVar3;
  
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 1) != 0) {
    value = (this->field_0)._impl_.lengthprefixed_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  if ((uVar1 & 2) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                       (2,(MessageLite *)(this->field_0)._impl_.nested_,target,stream);
  }
  if ((uVar1 & 4) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                       (3,(MessageLite *)(this->field_0)._impl_.grouplike_,target,stream);
  }
  if ((uVar1 & 8) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                       (4,(MessageLite *)(this->field_0)._impl_.notgrouplike_,target,stream);
  }
  if ((uVar1 & 0x10) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                       (5,(MessageLite *)(this->field_0)._impl_.notgrouplikescope_,target,stream);
  }
  if ((uVar1 & 0x20) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                       (6,(MessageLite *)(this->field_0)._impl_.messageimport_,target,stream);
  }
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_TestDelimited_default_instance_,target,stream);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestDelimited::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestDelimited& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:editions_unittest.TestDelimited)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .editions_unittest.TestDelimited.LengthPrefixed lengthprefixed = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.lengthprefixed_, this_._impl_.lengthprefixed_->GetCachedSize(), target,
        stream);
  }

  // .editions_unittest.TestDelimited nested = 2 [features = {
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        2, *this_._impl_.nested_, target, stream);
  }

  // .editions_unittest.TestDelimited.GroupLike grouplike = 3 [features = {
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        3, *this_._impl_.grouplike_, target, stream);
  }

  // .editions_unittest.TestDelimited.GroupLike notgrouplike = 4 [features = {
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        4, *this_._impl_.notgrouplike_, target, stream);
  }

  // .editions_unittest.NotGroupLikeScope notgrouplikescope = 5 [features = {
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        5, *this_._impl_.notgrouplikescope_, target, stream);
  }

  // .editions_unittest.MessageImport messageimport = 6 [features = {
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        6, *this_._impl_.messageimport_, target, stream);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:editions_unittest.TestDelimited)
  return target;
}